

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O2

void __thiscall ScriptHash_ScriptHash_hex_Test::TestBody(ScriptHash_ScriptHash_hex_Test *this)

{
  char *message;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [4];
  ScriptHash script_hash;
  
  std::__cxx11::string::string
            ((string *)local_48,
             "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf",
             (allocator *)&gtest_ar);
  cfd::core::ScriptHash::ScriptHash(&script_hash,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  cfd::core::ScriptHash::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"script_hash.GetHex().c_str()",
             "\"002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf\"",
             (char *)local_48[0].ptr_,
             "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
  std::__cxx11::string::~string((string *)local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scripthash.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ScriptHash::~ScriptHash(&script_hash);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex) {
  ScriptHash script_hash(
      "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
  EXPECT_STREQ(
      script_hash.GetHex().c_str(),
      "002016a2aa44989dab00f6c54dfc682ec482a0a061d289fd5ac39354c8dffed59ddf");
}